

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O0

gdImagePtr gdImageCreateFromWBMP(FILE *inFile)

{
  gdIOCtx *infile;
  gdIOCtx *in;
  gdImagePtr im;
  FILE *inFile_local;
  
  infile = gdNewFileCtx(inFile);
  if (infile == (gdIOCtx *)0x0) {
    inFile_local = (FILE *)0x0;
  }
  else {
    inFile_local = (FILE *)gdImageCreateFromWBMPCtx(infile);
    (*infile->gd_free)(infile);
  }
  return (gdImagePtr)inFile_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromWBMP(FILE *inFile)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewFileCtx(inFile);
	if (in == NULL) return NULL;
	im = gdImageCreateFromWBMPCtx(in);
	in->gd_free(in);
	return im;
}